

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention_x86_avx512::create_pipeline
          (MultiHeadAttention_x86_avx512 *this,Option *opt)

{
  long lVar1;
  long *plVar2;
  int *piVar3;
  _func_int **pp_Var4;
  undefined1 auVar5 [16];
  Layer *pLVar6;
  undefined8 *puVar7;
  void **ppvVar8;
  ParamDictPrivate **ppPVar9;
  undefined1 (*in_RSI) [64];
  long *in_RDI;
  undefined1 auVar10 [64];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [16];
  Mat weights_3 [2];
  ParamDict pd_6;
  ParamDict pd_5;
  Option opt1_1;
  ParamDict pd_4;
  Option opt1;
  ParamDict pd_3;
  Mat weights_2 [2];
  ParamDict pd_2;
  Mat weights_1 [2];
  ParamDict pd_1;
  Mat weights [2];
  ParamDict pd;
  float inv_sqrt_embed_dim_per_head;
  int embed_dim_per_head;
  ParamDict *in_stack_fffffffffffff560;
  int in_stack_fffffffffffff56c;
  Mat *in_stack_fffffffffffff578;
  ParamDict *in_stack_fffffffffffff580;
  ParamDict *pPVar12;
  ParamDict *local_a68;
  ParamDict *local_9f0;
  ParamDict *local_998;
  ParamDict *local_920;
  ParamDict *local_8f8;
  ParamDict *local_880;
  void **local_858;
  void **local_800;
  undefined1 local_7e8 [16];
  ParamDict local_7d8;
  _func_int **local_7c8;
  undefined4 local_7c0;
  _func_int **local_7b8;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  _func_int **local_798;
  void *local_790;
  int *local_788;
  void *local_780;
  undefined4 local_778;
  long *local_770;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  void *local_750;
  ParamDict local_748;
  undefined1 local_738 [16];
  ParamDict local_728;
  undefined4 local_718;
  undefined4 uStack_714;
  undefined1 auStack_710 [56];
  undefined1 local_6d8 [16];
  ParamDict local_6c8;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined1 auStack_6b0 [56];
  undefined1 local_678 [16];
  ParamDict local_668;
  undefined1 local_658 [16];
  ParamDict local_648;
  _func_int **local_638;
  undefined4 local_630;
  _func_int **local_628;
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 local_618;
  undefined4 local_614;
  undefined4 local_610;
  _func_int **local_608;
  void *local_600;
  int *local_5f8;
  void *local_5f0;
  undefined4 local_5e8;
  long *local_5e0;
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined4 local_5c8;
  void *local_5c0;
  ParamDict local_5b8;
  undefined1 local_5a8 [16];
  ParamDict local_598;
  _func_int **local_588;
  undefined4 local_580;
  _func_int **local_578;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  _func_int **local_558;
  void *local_550;
  int *local_548;
  void *local_540;
  undefined4 local_538;
  long *local_530;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  void *local_510;
  ParamDict local_508;
  undefined1 local_4f8 [16];
  void *local_4e8;
  int *local_4e0;
  void *local_4d8;
  undefined4 local_4d0;
  long *local_4c8;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  void *local_4a8;
  void *local_4a0;
  int *local_498;
  void *local_490;
  undefined4 local_488;
  long *local_480;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_468;
  void *local_460;
  void *apvStack_458 [2];
  ParamDict local_448;
  float local_438;
  int local_434;
  undefined1 (*local_430) [64];
  void **local_420;
  ParamDict *local_418;
  ParamDict *local_410;
  ParamDict *local_408;
  void **local_3f8;
  ParamDictPrivate **local_3e0;
  ParamDictPrivate **local_3c8;
  ParamDictPrivate **local_3b0;
  int local_3a0;
  undefined4 local_39c;
  void **local_398;
  void **local_390;
  void **local_388;
  int local_380;
  undefined4 local_37c;
  ParamDict *local_378;
  ParamDict *local_370;
  ParamDict *local_368;
  int local_360;
  undefined4 local_35c;
  void **local_358;
  void **local_350;
  void **local_348;
  int local_340;
  undefined4 local_33c;
  ParamDict *local_338;
  ParamDict *local_330;
  ParamDict *local_328;
  int local_320;
  undefined4 local_31c;
  void **local_318;
  void **local_310;
  void **local_308;
  int local_300;
  undefined4 local_2fc;
  ParamDict *local_2f8;
  ParamDict *local_2f0;
  ParamDict *local_2e8;
  int local_2e0;
  undefined4 local_2dc;
  void **local_2d8;
  void **local_2d0;
  void **local_2c8;
  int local_2c0;
  undefined4 local_2bc;
  void **local_2b8;
  void **local_2b0;
  void **local_2a8;
  int local_2a0;
  undefined4 local_29c;
  void **local_298;
  int local_290;
  undefined4 local_28c;
  void **local_288;
  int local_280;
  undefined4 local_27c;
  ParamDict *local_278;
  int local_270;
  undefined4 local_26c;
  void **local_268;
  int local_260;
  undefined4 local_25c;
  ParamDict *local_258;
  int local_250;
  undefined4 local_24c;
  void **local_248;
  int local_240;
  undefined4 local_23c;
  ParamDict *local_238;
  int local_230;
  undefined4 local_22c;
  void **local_228;
  int local_210;
  undefined4 local_20c;
  ParamDictPrivate **local_208;
  int local_1e0;
  undefined4 local_1dc;
  ParamDictPrivate **local_1d8;
  int local_1b0;
  undefined4 local_1ac;
  ParamDictPrivate **local_1a8;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  int local_160;
  undefined4 local_15c;
  undefined8 *local_158;
  int local_150;
  undefined4 local_14c;
  undefined8 *local_148;
  int local_140;
  undefined4 local_13c;
  undefined8 *local_138;
  int local_130;
  undefined4 local_12c;
  undefined8 *local_128;
  int local_120;
  undefined4 local_11c;
  undefined8 *local_118;
  int local_110;
  undefined4 local_10c;
  undefined8 *local_108;
  int local_100;
  undefined4 local_fc;
  undefined8 *local_f8;
  int local_f0;
  undefined4 local_ec;
  undefined8 *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  void *local_98;
  ParamDictPrivate *local_80;
  ParamDictPrivate *local_68;
  ParamDictPrivate *local_50;
  
  local_434 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
  auVar11._0_4_ = (float)local_434;
  auVar11._4_12_ = in_ZMM0._4_12_;
  auVar5 = vrsqrtss_avx(in_ZMM0._0_16_,auVar11);
  auVar11 = vfmadd213ss_fma(auVar5,ZEXT416((uint)(auVar11._0_4_ * auVar5._0_4_)),
                            SUB6416(ZEXT464(0xc0400000),0));
  local_438 = auVar5._0_4_ * -0.5 * auVar11._0_4_;
  local_430 = in_RSI;
  pLVar6 = create_layer(in_stack_fffffffffffff56c);
  in_RDI[1] = (long)pLVar6;
  ParamDict::ParamDict(in_stack_fffffffffffff580);
  ParamDict::set(&local_448,0,local_438);
  ParamDict::set(&local_448,1,1.0);
  ParamDict::set(&local_448,2,0);
  ParamDict::set(&local_448,3,1);
  ParamDict::set(&local_448,4,1);
  ParamDict::set(&local_448,5,0);
  ParamDict::set(&local_448,6,1);
  ParamDict::set(&local_448,7,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  ParamDict::set(&local_448,8,0);
  ParamDict::set(&local_448,9,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  ParamDict::set(&local_448,10,1);
  ParamDict::set(&local_448,0xb,0);
  ParamDict::set(&local_448,0xc,1);
  ParamDict::set(&local_448,0xe,0);
  (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],&local_448);
  local_800 = &local_4e8;
  do {
    local_420 = local_800;
    *local_800 = (void *)0x0;
    local_800[1] = (void *)0x0;
    local_800[2] = (void *)0x0;
    *(undefined4 *)(local_800 + 3) = 0;
    local_800[4] = (void *)0x0;
    *(undefined4 *)(local_800 + 5) = 0;
    *(undefined4 *)((long)local_800 + 0x2c) = 0;
    *(undefined4 *)(local_800 + 6) = 0;
    *(undefined4 *)((long)local_800 + 0x34) = 0;
    *(undefined4 *)(local_800 + 7) = 0;
    local_800[8] = (void *)0x0;
    local_800 = local_800 + 9;
  } while (local_800 != apvStack_458);
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_2b8 = (void **)((long)in_RDI + lVar1 + 0xe8);
  local_2b0 = &local_4e8;
  if (&local_4e8 != local_2b8) {
    if (*(long *)((long)in_RDI + lVar1 + 0xf0) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0xf0);
      local_2bc = 1;
      LOCK();
      local_2c0 = *piVar3;
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_298 = &local_4e8;
    if (local_4e0 != (int *)0x0) {
      local_29c = 0xffffffff;
      LOCK();
      local_2a0 = *local_4e0;
      *local_4e0 = *local_4e0 + -1;
      UNLOCK();
      if (local_2a0 == 1) {
        if (local_4c8 == (long *)0x0) {
          if (local_4e8 != (void *)0x0) {
            free(local_4e8);
          }
        }
        else {
          (**(code **)(*local_4c8 + 0x18))(local_4c8,local_4e8);
        }
      }
    }
    local_4e8 = *local_2b8;
    local_4e0 = (int *)local_2b8[1];
    local_4d8 = local_2b8[2];
    local_4d0 = *(undefined4 *)(local_2b8 + 3);
    local_4c8 = (long *)local_2b8[4];
    local_4c0 = *(undefined4 *)(local_2b8 + 5);
    local_4bc = *(undefined4 *)((long)local_2b8 + 0x2c);
    local_4b8 = *(undefined4 *)(local_2b8 + 6);
    local_4b4 = *(undefined4 *)((long)local_2b8 + 0x34);
    local_4b0 = *(undefined4 *)(local_2b8 + 7);
    local_4a8 = local_2b8[8];
  }
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_2d8 = (void **)((long)in_RDI + lVar1 + 0x130);
  local_2d0 = &local_4a0;
  local_2a8 = &local_4e8;
  if (&local_4a0 != local_2d8) {
    if (*(long *)((long)in_RDI + lVar1 + 0x138) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x138);
      local_2dc = 1;
      LOCK();
      local_2e0 = *piVar3;
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_288 = &local_4a0;
    if (local_498 != (int *)0x0) {
      local_28c = 0xffffffff;
      LOCK();
      local_290 = *local_498;
      *local_498 = *local_498 + -1;
      UNLOCK();
      if (local_290 == 1) {
        if (local_480 == (long *)0x0) {
          if (local_4a0 != (void *)0x0) {
            free(local_4a0);
          }
        }
        else {
          (**(code **)(*local_480 + 0x18))(local_480,local_4a0);
        }
      }
    }
    local_4a0 = *local_2d8;
    local_498 = (int *)local_2d8[1];
    local_490 = local_2d8[2];
    local_488 = *(undefined4 *)(local_2d8 + 3);
    local_480 = (long *)local_2d8[4];
    local_478 = *(undefined4 *)(local_2d8 + 5);
    local_474 = *(undefined4 *)((long)local_2d8 + 0x2c);
    local_470 = *(undefined4 *)(local_2d8 + 6);
    local_46c = *(undefined4 *)((long)local_2d8 + 0x34);
    local_468 = *(undefined4 *)(local_2d8 + 7);
    local_460 = local_2d8[8];
  }
  plVar2 = (long *)in_RDI[1];
  local_2c8 = &local_4a0;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  (**(code **)(*plVar2 + 0x18))(plVar2,local_4f8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff560);
  (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],local_430);
  if (((*local_430)[0] & 1) != 0) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0xe8);
    local_e8 = puVar7;
    if (*(long *)((long)in_RDI + lVar1 + 0xf0) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0xf0);
      local_ec = 0xffffffff;
      LOCK();
      local_f0 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (local_f0 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x108) == 0) {
          local_e0 = (void *)*puVar7;
          if (local_e0 != (void *)0x0) {
            free(local_e0);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar1 + 0x108);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0xf8) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x100) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x110) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x114) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x118) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x11c) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x120) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x128) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0xf0) = 0;
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x130);
    local_f8 = puVar7;
    if (*(long *)((long)in_RDI + lVar1 + 0x138) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x138);
      local_fc = 0xffffffff;
      LOCK();
      local_100 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (local_100 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x150) == 0) {
          local_d8 = (void *)*puVar7;
          if (local_d8 != (void *)0x0) {
            free(local_d8);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar1 + 0x150);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x140) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x148) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x158) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x15c) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x160) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x164) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x168) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x170) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x138) = 0;
  }
  local_858 = apvStack_458;
  do {
    ppvVar8 = local_858 + -9;
    local_3f8 = ppvVar8;
    local_178 = ppvVar8;
    if (local_858[-8] != (void *)0x0) {
      piVar3 = (int *)local_858[-8];
      local_17c = 0xffffffff;
      LOCK();
      local_180 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (local_180 == 1) {
        if (local_858[-5] == (void *)0x0) {
          local_98 = *ppvVar8;
          if (local_98 != (void *)0x0) {
            free(local_98);
          }
        }
        else {
          (**(code **)(*local_858[-5] + 0x18))(local_858[-5],*ppvVar8);
        }
      }
    }
    *ppvVar8 = (void *)0x0;
    local_858[-7] = (void *)0x0;
    *(undefined4 *)(local_858 + -6) = 0;
    *(undefined4 *)(local_858 + -4) = 0;
    *(undefined4 *)((long)local_858 + -0x1c) = 0;
    *(undefined4 *)(local_858 + -3) = 0;
    *(undefined4 *)((long)local_858 + -0x14) = 0;
    *(undefined4 *)(local_858 + -2) = 0;
    local_858[-1] = (void *)0x0;
    local_858[-8] = (void *)0x0;
    local_858 = ppvVar8;
  } while (ppvVar8 != &local_4e8);
  ParamDict::~ParamDict(in_stack_fffffffffffff560);
  pLVar6 = create_layer(in_stack_fffffffffffff56c);
  in_RDI[2] = (long)pLVar6;
  ParamDict::ParamDict(in_stack_fffffffffffff580);
  ParamDict::set(&local_508,2,0);
  ParamDict::set(&local_508,3,1);
  ParamDict::set(&local_508,4,1);
  ParamDict::set(&local_508,5,0);
  ParamDict::set(&local_508,6,1);
  ParamDict::set(&local_508,7,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  ParamDict::set(&local_508,8,0);
  ParamDict::set(&local_508,9,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc));
  ParamDict::set(&local_508,10,1);
  ParamDict::set(&local_508,0xb,0);
  ParamDict::set(&local_508,0xc,1);
  ParamDict::set(&local_508,0xe,0);
  (**(code **)(*(long *)in_RDI[2] + 0x10))((long *)in_RDI[2],&local_508);
  local_880 = &local_598;
  do {
    local_418 = local_880;
    local_880->_vptr_ParamDict = (_func_int **)0x0;
    local_880->d = (ParamDictPrivate *)0x0;
    local_880[1]._vptr_ParamDict = (_func_int **)0x0;
    *(undefined4 *)&local_880[1].d = 0;
    local_880[2]._vptr_ParamDict = (_func_int **)0x0;
    *(undefined4 *)&local_880[2].d = 0;
    *(undefined4 *)((long)&local_880[2].d + 4) = 0;
    *(undefined4 *)&local_880[3]._vptr_ParamDict = 0;
    *(undefined4 *)((long)&local_880[3]._vptr_ParamDict + 4) = 0;
    *(undefined4 *)&local_880[3].d = 0;
    local_880[4]._vptr_ParamDict = (_func_int **)0x0;
    local_880 = (ParamDict *)&local_880[4].d;
  } while (local_880 != &local_508);
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_2f8 = (ParamDict *)((long)in_RDI + lVar1 + 0x178);
  local_2f0 = &local_598;
  if (&local_598 != local_2f8) {
    if (*(long *)((long)in_RDI + lVar1 + 0x180) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x180);
      local_2fc = 1;
      LOCK();
      local_300 = *piVar3;
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_278 = &local_598;
    if (local_598.d != (ParamDictPrivate *)0x0) {
      local_27c = 0xffffffff;
      LOCK();
      local_280 = (local_598.d)->params[0].type;
      (local_598.d)->params[0].type = (local_598.d)->params[0].type + -1;
      UNLOCK();
      if (local_280 == 1) {
        if (local_578 == (_func_int **)0x0) {
          if (local_598._vptr_ParamDict != (_func_int **)0x0) {
            free(local_598._vptr_ParamDict);
          }
        }
        else {
          (**(code **)(*local_578 + 0x18))(local_578,local_598._vptr_ParamDict);
        }
      }
    }
    local_598._vptr_ParamDict = local_2f8->_vptr_ParamDict;
    local_598.d = local_2f8->d;
    local_588 = local_2f8[1]._vptr_ParamDict;
    local_580 = *(undefined4 *)&local_2f8[1].d;
    local_578 = local_2f8[2]._vptr_ParamDict;
    local_570 = *(undefined4 *)&local_2f8[2].d;
    local_56c = *(undefined4 *)((long)&local_2f8[2].d + 4);
    local_568 = *(undefined4 *)&local_2f8[3]._vptr_ParamDict;
    local_564 = *(undefined4 *)((long)&local_2f8[3]._vptr_ParamDict + 4);
    local_560 = *(undefined4 *)&local_2f8[3].d;
    local_558 = local_2f8[4]._vptr_ParamDict;
  }
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_318 = (void **)((long)in_RDI + lVar1 + 0x1c0);
  local_310 = &local_550;
  local_2e8 = &local_598;
  if (&local_550 != local_318) {
    if (*(long *)((long)in_RDI + lVar1 + 0x1c8) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x1c8);
      local_31c = 1;
      LOCK();
      local_320 = *piVar3;
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_268 = &local_550;
    if (local_548 != (int *)0x0) {
      local_26c = 0xffffffff;
      LOCK();
      local_270 = *local_548;
      *local_548 = *local_548 + -1;
      UNLOCK();
      if (local_270 == 1) {
        if (local_530 == (long *)0x0) {
          if (local_550 != (void *)0x0) {
            free(local_550);
          }
        }
        else {
          (**(code **)(*local_530 + 0x18))(local_530,local_550);
        }
      }
    }
    local_550 = *local_318;
    local_548 = (int *)local_318[1];
    local_540 = local_318[2];
    local_538 = *(undefined4 *)(local_318 + 3);
    local_530 = (long *)local_318[4];
    local_528 = *(undefined4 *)(local_318 + 5);
    local_524 = *(undefined4 *)((long)local_318 + 0x2c);
    local_520 = *(undefined4 *)(local_318 + 6);
    local_51c = *(undefined4 *)((long)local_318 + 0x34);
    local_518 = *(undefined4 *)(local_318 + 7);
    local_510 = local_318[8];
  }
  plVar2 = (long *)in_RDI[2];
  local_308 = &local_550;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  (**(code **)(*plVar2 + 0x18))(plVar2,local_5a8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff560);
  (**(code **)(*(long *)in_RDI[2] + 0x20))((long *)in_RDI[2],local_430);
  if (((*local_430)[0] & 1) != 0) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x178);
    local_108 = puVar7;
    if (*(long *)((long)in_RDI + lVar1 + 0x180) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x180);
      local_10c = 0xffffffff;
      LOCK();
      local_110 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (local_110 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x198) == 0) {
          local_d0 = (void *)*puVar7;
          if (local_d0 != (void *)0x0) {
            free(local_d0);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar1 + 0x198);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x188) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 400) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1a4) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1a8) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1ac) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1b0) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x1b8) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x180) = 0;
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x1c0);
    local_118 = puVar7;
    if (*(long *)((long)in_RDI + lVar1 + 0x1c8) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x1c8);
      local_11c = 0xffffffff;
      LOCK();
      local_120 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (local_120 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x1e0) == 0) {
          local_c8 = (void *)*puVar7;
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar1 + 0x1e0);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x1d0) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1d8) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1e8) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1ec) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1f0) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 500) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1f8) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x200) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x1c8) = 0;
  }
  local_8f8 = &local_508;
  do {
    ppPVar9 = &local_8f8[-5].d;
    local_3e0 = ppPVar9;
    local_1a8 = ppPVar9;
    if (local_8f8[-4]._vptr_ParamDict != (_func_int **)0x0) {
      pp_Var4 = local_8f8[-4]._vptr_ParamDict;
      local_1ac = 0xffffffff;
      LOCK();
      local_1b0 = *(int *)pp_Var4;
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      UNLOCK();
      if (local_1b0 == 1) {
        if (local_8f8[-3].d == (ParamDictPrivate *)0x0) {
          local_80 = *ppPVar9;
          if (local_80 != (ParamDictPrivate *)0x0) {
            free(local_80);
          }
        }
        else {
          (**(code **)(*(long *)(local_8f8[-3].d)->params + 0x18))(local_8f8[-3].d,*ppPVar9);
        }
      }
    }
    *ppPVar9 = (ParamDictPrivate *)0x0;
    local_8f8[-4].d = (ParamDictPrivate *)0x0;
    *(undefined4 *)&local_8f8[-3]._vptr_ParamDict = 0;
    *(undefined4 *)&local_8f8[-2]._vptr_ParamDict = 0;
    *(undefined4 *)((long)&local_8f8[-2]._vptr_ParamDict + 4) = 0;
    *(undefined4 *)&local_8f8[-2].d = 0;
    *(undefined4 *)((long)&local_8f8[-2].d + 4) = 0;
    *(undefined4 *)&local_8f8[-1]._vptr_ParamDict = 0;
    local_8f8[-1].d = (ParamDictPrivate *)0x0;
    local_8f8[-4]._vptr_ParamDict = (_func_int **)0x0;
    local_8f8 = (ParamDict *)ppPVar9;
  } while ((ParamDict *)ppPVar9 != &local_598);
  ParamDict::~ParamDict(in_stack_fffffffffffff560);
  pLVar6 = create_layer(in_stack_fffffffffffff56c);
  in_RDI[3] = (long)pLVar6;
  ParamDict::ParamDict(in_stack_fffffffffffff580);
  ParamDict::set(&local_5b8,2,0);
  ParamDict::set(&local_5b8,3,1);
  ParamDict::set(&local_5b8,4,1);
  ParamDict::set(&local_5b8,5,0);
  ParamDict::set(&local_5b8,6,1);
  ParamDict::set(&local_5b8,7,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  ParamDict::set(&local_5b8,8,0);
  ParamDict::set(&local_5b8,9,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0));
  ParamDict::set(&local_5b8,10,1);
  ParamDict::set(&local_5b8,0xb,0);
  ParamDict::set(&local_5b8,0xc,1);
  ParamDict::set(&local_5b8,0xe,0);
  (**(code **)(*(long *)in_RDI[3] + 0x10))((long *)in_RDI[3],&local_5b8);
  local_920 = &local_648;
  do {
    local_410 = local_920;
    local_920->_vptr_ParamDict = (_func_int **)0x0;
    local_920->d = (ParamDictPrivate *)0x0;
    local_920[1]._vptr_ParamDict = (_func_int **)0x0;
    *(undefined4 *)&local_920[1].d = 0;
    local_920[2]._vptr_ParamDict = (_func_int **)0x0;
    *(undefined4 *)&local_920[2].d = 0;
    *(undefined4 *)((long)&local_920[2].d + 4) = 0;
    *(undefined4 *)&local_920[3]._vptr_ParamDict = 0;
    *(undefined4 *)((long)&local_920[3]._vptr_ParamDict + 4) = 0;
    *(undefined4 *)&local_920[3].d = 0;
    local_920[4]._vptr_ParamDict = (_func_int **)0x0;
    local_920 = (ParamDict *)&local_920[4].d;
  } while (local_920 != &local_5b8);
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_338 = (ParamDict *)((long)in_RDI + lVar1 + 0x208);
  local_330 = &local_648;
  if (&local_648 != local_338) {
    if (*(long *)((long)in_RDI + lVar1 + 0x210) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x210);
      local_33c = 1;
      LOCK();
      local_340 = *piVar3;
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_258 = &local_648;
    if (local_648.d != (ParamDictPrivate *)0x0) {
      local_25c = 0xffffffff;
      LOCK();
      local_260 = (local_648.d)->params[0].type;
      (local_648.d)->params[0].type = (local_648.d)->params[0].type + -1;
      UNLOCK();
      if (local_260 == 1) {
        if (local_628 == (_func_int **)0x0) {
          if (local_648._vptr_ParamDict != (_func_int **)0x0) {
            free(local_648._vptr_ParamDict);
          }
        }
        else {
          (**(code **)(*local_628 + 0x18))(local_628,local_648._vptr_ParamDict);
        }
      }
    }
    local_648._vptr_ParamDict = local_338->_vptr_ParamDict;
    local_648.d = local_338->d;
    local_638 = local_338[1]._vptr_ParamDict;
    local_630 = *(undefined4 *)&local_338[1].d;
    local_628 = local_338[2]._vptr_ParamDict;
    local_620 = *(undefined4 *)&local_338[2].d;
    local_61c = *(undefined4 *)((long)&local_338[2].d + 4);
    local_618 = *(undefined4 *)&local_338[3]._vptr_ParamDict;
    local_614 = *(undefined4 *)((long)&local_338[3]._vptr_ParamDict + 4);
    local_610 = *(undefined4 *)&local_338[3].d;
    local_608 = local_338[4]._vptr_ParamDict;
  }
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_358 = (void **)((long)in_RDI + lVar1 + 0x250);
  local_350 = &local_600;
  local_328 = &local_648;
  if (&local_600 != local_358) {
    if (*(long *)((long)in_RDI + lVar1 + 600) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 600);
      local_35c = 1;
      LOCK();
      local_360 = *piVar3;
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_248 = &local_600;
    if (local_5f8 != (int *)0x0) {
      local_24c = 0xffffffff;
      LOCK();
      local_250 = *local_5f8;
      *local_5f8 = *local_5f8 + -1;
      UNLOCK();
      if (local_250 == 1) {
        if (local_5e0 == (long *)0x0) {
          if (local_600 != (void *)0x0) {
            free(local_600);
          }
        }
        else {
          (**(code **)(*local_5e0 + 0x18))(local_5e0,local_600);
        }
      }
    }
    local_600 = *local_358;
    local_5f8 = (int *)local_358[1];
    local_5f0 = local_358[2];
    local_5e8 = *(undefined4 *)(local_358 + 3);
    local_5e0 = (long *)local_358[4];
    local_5d8 = *(undefined4 *)(local_358 + 5);
    local_5d4 = *(undefined4 *)((long)local_358 + 0x2c);
    local_5d0 = *(undefined4 *)(local_358 + 6);
    local_5cc = *(undefined4 *)((long)local_358 + 0x34);
    local_5c8 = *(undefined4 *)(local_358 + 7);
    local_5c0 = local_358[8];
  }
  plVar2 = (long *)in_RDI[3];
  local_348 = &local_600;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  (**(code **)(*plVar2 + 0x18))(plVar2,local_658);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff560);
  (**(code **)(*(long *)in_RDI[3] + 0x20))((long *)in_RDI[3],local_430);
  if (((*local_430)[0] & 1) != 0) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x208);
    local_128 = puVar7;
    if (*(long *)((long)in_RDI + lVar1 + 0x210) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x210);
      local_12c = 0xffffffff;
      LOCK();
      local_130 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (local_130 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x228) == 0) {
          local_c0 = (void *)*puVar7;
          if (local_c0 != (void *)0x0) {
            free(local_c0);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar1 + 0x228);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x218) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x220) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x230) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x234) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x238) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x23c) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x240) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x248) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x210) = 0;
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x250);
    local_138 = puVar7;
    if (*(long *)((long)in_RDI + lVar1 + 600) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 600);
      local_13c = 0xffffffff;
      LOCK();
      local_140 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (local_140 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x270) == 0) {
          local_b8 = (void *)*puVar7;
          if (local_b8 != (void *)0x0) {
            free(local_b8);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar1 + 0x270);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x260) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x268) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x278) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x27c) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x280) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x284) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x288) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x290) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 600) = 0;
  }
  local_998 = &local_5b8;
  do {
    ppPVar9 = &local_998[-5].d;
    local_3c8 = ppPVar9;
    local_1d8 = ppPVar9;
    if (local_998[-4]._vptr_ParamDict != (_func_int **)0x0) {
      pp_Var4 = local_998[-4]._vptr_ParamDict;
      local_1dc = 0xffffffff;
      LOCK();
      local_1e0 = *(int *)pp_Var4;
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      UNLOCK();
      if (local_1e0 == 1) {
        if (local_998[-3].d == (ParamDictPrivate *)0x0) {
          local_68 = *ppPVar9;
          if (local_68 != (ParamDictPrivate *)0x0) {
            free(local_68);
          }
        }
        else {
          (**(code **)(*(long *)(local_998[-3].d)->params + 0x18))(local_998[-3].d,*ppPVar9);
        }
      }
    }
    *ppPVar9 = (ParamDictPrivate *)0x0;
    local_998[-4].d = (ParamDictPrivate *)0x0;
    *(undefined4 *)&local_998[-3]._vptr_ParamDict = 0;
    *(undefined4 *)&local_998[-2]._vptr_ParamDict = 0;
    *(undefined4 *)((long)&local_998[-2]._vptr_ParamDict + 4) = 0;
    *(undefined4 *)&local_998[-2].d = 0;
    *(undefined4 *)((long)&local_998[-2].d + 4) = 0;
    *(undefined4 *)&local_998[-1]._vptr_ParamDict = 0;
    local_998[-1].d = (ParamDictPrivate *)0x0;
    local_998[-4]._vptr_ParamDict = (_func_int **)0x0;
    local_998 = (ParamDict *)ppPVar9;
  } while ((ParamDict *)ppPVar9 != &local_648);
  ParamDict::~ParamDict(in_stack_fffffffffffff560);
  pLVar6 = create_layer(in_stack_fffffffffffff56c);
  in_RDI[5] = (long)pLVar6;
  ParamDict::ParamDict(in_stack_fffffffffffff580);
  ParamDict::set(&local_668,2,1);
  ParamDict::set(&local_668,3,0);
  ParamDict::set(&local_668,4,0);
  ParamDict::set(&local_668,5,0);
  ParamDict::set(&local_668,6,
                 (uint)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0));
  ParamDict::set(&local_668,7,0);
  ParamDict::set(&local_668,8,0);
  ParamDict::set(&local_668,9,0);
  ParamDict::set(&local_668,10,
                 -(uint)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) | 3);
  ParamDict::set(&local_668,0xb,0);
  ParamDict::set(&local_668,0xc,1);
  (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_668);
  plVar2 = (long *)in_RDI[5];
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  (**(code **)(*plVar2 + 0x18))(plVar2,local_678);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff560);
  auVar10 = vmovdqu64_avx512f(*local_430);
  auVar10 = vmovdqu64_avx512f(auVar10);
  auStack_6b0 = auVar10._8_56_;
  local_6b8 = auVar10._0_4_;
  uStack_6b4 = 1;
  (**(code **)(*(long *)in_RDI[5] + 0x20))((long *)in_RDI[5],&local_6b8);
  ParamDict::~ParamDict(in_stack_fffffffffffff560);
  pLVar6 = create_layer(in_stack_fffffffffffff56c);
  in_RDI[6] = (long)pLVar6;
  ParamDict::ParamDict(in_stack_fffffffffffff580);
  ParamDict::set(&local_6c8,2,0);
  ParamDict::set(&local_6c8,3,1);
  ParamDict::set(&local_6c8,4,0);
  ParamDict::set(&local_6c8,5,0);
  ParamDict::set(&local_6c8,6,1);
  ParamDict::set(&local_6c8,7,0);
  ParamDict::set(&local_6c8,8,0);
  ParamDict::set(&local_6c8,9,0);
  ParamDict::set(&local_6c8,10,-1);
  ParamDict::set(&local_6c8,0xb,0);
  ParamDict::set(&local_6c8,0xc,1);
  ParamDict::set(&local_6c8,0xe,1);
  (**(code **)(*(long *)in_RDI[6] + 0x10))((long *)in_RDI[6],&local_6c8);
  plVar2 = (long *)in_RDI[6];
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  (**(code **)(*plVar2 + 0x18))(plVar2,local_6d8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff560);
  auVar10 = vmovdqu64_avx512f(*local_430);
  auVar10 = vmovdqu64_avx512f(auVar10);
  auStack_710 = auVar10._8_56_;
  local_718 = auVar10._0_4_;
  uStack_714 = 1;
  (**(code **)(*(long *)in_RDI[6] + 0x20))();
  ParamDict::~ParamDict(in_stack_fffffffffffff560);
  pLVar6 = create_layer(in_stack_fffffffffffff56c);
  in_RDI[7] = (long)pLVar6;
  ParamDict::ParamDict(in_stack_fffffffffffff580);
  ParamDict::set(&local_728,0,-1);
  ParamDict::set(&local_728,1,1);
  (**(code **)(*(long *)in_RDI[7] + 0x10))((long *)in_RDI[7],&local_728);
  plVar2 = (long *)in_RDI[7];
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  (**(code **)(*plVar2 + 0x18))(plVar2,local_738);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff560);
  (**(code **)(*(long *)in_RDI[7] + 0x20))((long *)in_RDI[7],local_430);
  ParamDict::~ParamDict(in_stack_fffffffffffff560);
  pLVar6 = create_layer(in_stack_fffffffffffff56c);
  in_RDI[4] = (long)pLVar6;
  ParamDict::ParamDict(in_stack_fffffffffffff580);
  ParamDict::set(&local_748,2,1);
  ParamDict::set(&local_748,3,1);
  ParamDict::set(&local_748,4,0);
  ParamDict::set(&local_748,5,1);
  ParamDict::set(&local_748,6,1);
  ParamDict::set(&local_748,7,0);
  ParamDict::set(&local_748,8,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  ParamDict::set(&local_748,9,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  ParamDict::set(&local_748,10,4);
  ParamDict::set(&local_748,0xb,0);
  (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],&local_748);
  local_9f0 = &local_7d8;
  do {
    local_408 = local_9f0;
    local_9f0->_vptr_ParamDict = (_func_int **)0x0;
    local_9f0->d = (ParamDictPrivate *)0x0;
    local_9f0[1]._vptr_ParamDict = (_func_int **)0x0;
    *(undefined4 *)&local_9f0[1].d = 0;
    local_9f0[2]._vptr_ParamDict = (_func_int **)0x0;
    *(undefined4 *)&local_9f0[2].d = 0;
    *(undefined4 *)((long)&local_9f0[2].d + 4) = 0;
    *(undefined4 *)&local_9f0[3]._vptr_ParamDict = 0;
    *(undefined4 *)((long)&local_9f0[3]._vptr_ParamDict + 4) = 0;
    *(undefined4 *)&local_9f0[3].d = 0;
    local_9f0[4]._vptr_ParamDict = (_func_int **)0x0;
    local_9f0 = (ParamDict *)&local_9f0[4].d;
  } while (local_9f0 != &local_748);
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_378 = (ParamDict *)((long)in_RDI + lVar1 + 0x298);
  local_370 = &local_7d8;
  if (&local_7d8 != local_378) {
    if (*(long *)((long)in_RDI + lVar1 + 0x2a0) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x2a0);
      local_37c = 1;
      LOCK();
      local_380 = *piVar3;
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_238 = &local_7d8;
    if (local_7d8.d != (ParamDictPrivate *)0x0) {
      local_23c = 0xffffffff;
      LOCK();
      local_240 = (local_7d8.d)->params[0].type;
      (local_7d8.d)->params[0].type = (local_7d8.d)->params[0].type + -1;
      UNLOCK();
      if (local_240 == 1) {
        if (local_7b8 == (_func_int **)0x0) {
          if (local_7d8._vptr_ParamDict != (_func_int **)0x0) {
            free(local_7d8._vptr_ParamDict);
          }
        }
        else {
          (**(code **)(*local_7b8 + 0x18))(local_7b8,local_7d8._vptr_ParamDict);
        }
      }
    }
    local_7d8._vptr_ParamDict = local_378->_vptr_ParamDict;
    local_7d8.d = local_378->d;
    local_7c8 = local_378[1]._vptr_ParamDict;
    local_7c0 = *(undefined4 *)&local_378[1].d;
    local_7b8 = local_378[2]._vptr_ParamDict;
    local_7b0 = *(undefined4 *)&local_378[2].d;
    local_7ac = *(undefined4 *)((long)&local_378[2].d + 4);
    local_7a8 = *(undefined4 *)&local_378[3]._vptr_ParamDict;
    local_7a4 = *(undefined4 *)((long)&local_378[3]._vptr_ParamDict + 4);
    local_7a0 = *(undefined4 *)&local_378[3].d;
    local_798 = local_378[4]._vptr_ParamDict;
  }
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_398 = (void **)((long)in_RDI + lVar1 + 0x2e0);
  local_390 = &local_790;
  local_368 = &local_7d8;
  if (&local_790 != local_398) {
    if (*(long *)((long)in_RDI + lVar1 + 0x2e8) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x2e8);
      local_39c = 1;
      LOCK();
      local_3a0 = *piVar3;
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_228 = &local_790;
    if (local_788 != (int *)0x0) {
      local_22c = 0xffffffff;
      LOCK();
      local_230 = *local_788;
      *local_788 = *local_788 + -1;
      UNLOCK();
      if (local_230 == 1) {
        if (local_770 == (long *)0x0) {
          if (local_790 != (void *)0x0) {
            free(local_790);
          }
        }
        else {
          (**(code **)(*local_770 + 0x18))(local_770,local_790);
        }
      }
    }
    local_790 = *local_398;
    local_788 = (int *)local_398[1];
    local_780 = local_398[2];
    local_778 = *(undefined4 *)(local_398 + 3);
    local_770 = (long *)local_398[4];
    local_768 = *(undefined4 *)(local_398 + 5);
    local_764 = *(undefined4 *)((long)local_398 + 0x2c);
    local_760 = *(undefined4 *)(local_398 + 6);
    local_75c = *(undefined4 *)((long)local_398 + 0x34);
    local_758 = *(undefined4 *)(local_398 + 7);
    local_750 = local_398[8];
  }
  plVar2 = (long *)in_RDI[4];
  local_388 = &local_790;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  (**(code **)(*plVar2 + 0x18))(plVar2,local_7e8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff560);
  (**(code **)(*(long *)in_RDI[4] + 0x20))((long *)in_RDI[4],local_430);
  if (((*local_430)[0] & 1) != 0) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x298);
    local_148 = puVar7;
    if (*(long *)((long)in_RDI + lVar1 + 0x2a0) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x2a0);
      local_14c = 0xffffffff;
      LOCK();
      local_150 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (local_150 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x2b8) == 0) {
          local_b0 = (void *)*puVar7;
          if (local_b0 != (void *)0x0) {
            free(local_b0);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar1 + 0x2b8);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x2a8) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x2b0) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x2c0) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x2c4) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x2c8) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x2cc) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x2d0) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x2d8) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x2a0) = 0;
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar7 = (undefined8 *)((long)in_RDI + lVar1 + 0x2e0);
    local_158 = puVar7;
    if (*(long *)((long)in_RDI + lVar1 + 0x2e8) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar1 + 0x2e8);
      local_15c = 0xffffffff;
      LOCK();
      local_160 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (local_160 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x300) == 0) {
          local_a8 = (void *)*puVar7;
          if (local_a8 != (void *)0x0) {
            free(local_a8);
          }
        }
        else {
          plVar2 = *(long **)((long)in_RDI + lVar1 + 0x300);
          (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
        }
      }
    }
    *puVar7 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x2f0) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x2f8) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x308) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x30c) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x310) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x314) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x318) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 800) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x2e8) = 0;
  }
  local_a68 = &local_748;
  do {
    ppPVar9 = &local_a68[-5].d;
    pPVar12 = (ParamDict *)ppPVar9;
    local_3b0 = ppPVar9;
    local_208 = ppPVar9;
    if (local_a68[-4]._vptr_ParamDict != (_func_int **)0x0) {
      pp_Var4 = local_a68[-4]._vptr_ParamDict;
      local_20c = 0xffffffff;
      LOCK();
      local_210 = *(int *)pp_Var4;
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      UNLOCK();
      if (local_210 == 1) {
        if (local_a68[-3].d == (ParamDictPrivate *)0x0) {
          local_50 = *ppPVar9;
          if (local_50 != (ParamDictPrivate *)0x0) {
            free(local_50);
          }
        }
        else {
          (**(code **)(*(long *)(local_a68[-3].d)->params + 0x18))(local_a68[-3].d,*ppPVar9);
        }
      }
    }
    *ppPVar9 = (ParamDictPrivate *)0x0;
    local_a68[-4].d = (ParamDictPrivate *)0x0;
    *(undefined4 *)&local_a68[-3]._vptr_ParamDict = 0;
    *(undefined4 *)&local_a68[-2]._vptr_ParamDict = 0;
    *(undefined4 *)((long)&local_a68[-2]._vptr_ParamDict + 4) = 0;
    *(undefined4 *)&local_a68[-2].d = 0;
    *(undefined4 *)((long)&local_a68[-2].d + 4) = 0;
    *(undefined4 *)&local_a68[-1]._vptr_ParamDict = 0;
    local_a68[-1].d = (ParamDictPrivate *)0x0;
    local_a68[-4]._vptr_ParamDict = (_func_int **)0x0;
    local_a68 = pPVar12;
  } while (pPVar12 != &local_7d8);
  ParamDict::~ParamDict(in_stack_fffffffffffff560);
  return 0;
}

Assistant:

int MultiHeadAttention_x86_avx512::create_pipeline(const Option& opt)
{
    {
        const int embed_dim_per_head = embed_dim / num_heads;
        const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

        q_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(0, inv_sqrt_embed_dim_per_head);
        pd.set(1, 1.f);
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, embed_dim); // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        q_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = q_weight_data;
        weights[1] = q_bias_data;
        q_gemm->load_model(ModelBinFromMatArray(weights));
        q_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            q_weight_data.release();
            q_bias_data.release();
        }
    }

    {
        k_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, kdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        k_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = k_weight_data;
        weights[1] = k_bias_data;
        k_gemm->load_model(ModelBinFromMatArray(weights));
        k_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            k_weight_data.release();
            k_bias_data.release();
        }
    }

    {
        v_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, vdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        v_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = v_weight_data;
        weights[1] = v_bias_data;
        v_gemm->load_model(ModelBinFromMatArray(weights));
        v_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            v_weight_data.release();
            v_bias_data.release();
        }
    }

    {
        qk_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 0);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, attn_mask ? 0 : 1);   // constantC
        pd.set(7, 0);                   // M
        pd.set(8, 0);                   // N
        pd.set(9, 0);                   // K
        pd.set(10, attn_mask ? 3 : -1); // constant_broadcast_type_C
        pd.set(11, 0);                  // output_N1M
        pd.set(12, 1);                  // output_elempack
        qk_gemm->load_param(pd);
        qk_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->create_pipeline(opt1);
    }
    {
        qkv_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);   // transA
        pd.set(3, 1);   // transB
        pd.set(4, 0);   // constantA
        pd.set(5, 0);   // constantB
        pd.set(6, 1);   // constantC
        pd.set(7, 0);   // M
        pd.set(8, 0);   // N
        pd.set(9, 0);   // K
        pd.set(10, -1); // constant_broadcast_type_C
        pd.set(11, 0);  // output_N1M
        pd.set(12, 1);  // output_elempack
        pd.set(14, 1);  // output_transpose
        qkv_gemm->load_param(pd);
        qkv_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->create_pipeline(opt1);
    }

    {
        qk_softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
        ncnn::ParamDict pd;
        pd.set(0, -1);
        pd.set(1, 1);
        qk_softmax->load_param(pd);
        qk_softmax->load_model(ModelBinFromMatArray(0));
        qk_softmax->create_pipeline(opt);
    }

    {
        o_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 0);         // constantA
        pd.set(5, 1);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, 0);         // M = outch
        pd.set(8, embed_dim); // N = size
        pd.set(9, embed_dim); // K = maxk*inch
        pd.set(10, 4);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        o_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = out_weight_data;
        weights[1] = out_bias_data;
        o_gemm->load_model(ModelBinFromMatArray(weights));
        o_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            out_weight_data.release();
            out_bias_data.release();
        }
    }

    return 0;
}